

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dial(nng_socket sid,char *addr,nng_dialer *dp,int flags)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *pnStack_40;
  nng_dialer did;
  nni_sock *s;
  nni_dialer *pnStack_30;
  int rv;
  nni_dialer *d;
  nng_dialer *pnStack_20;
  int flags_local;
  nng_dialer *dp_local;
  char *addr_local;
  nng_socket sid_local;
  
  d._4_4_ = flags;
  pnStack_20 = dp;
  dp_local = (nng_dialer *)addr;
  addr_local._0_4_ = sid.id;
  addr_local._4_4_ = nni_sock_find(&stack0xffffffffffffffc0,sid.id);
  if (addr_local._4_4_ == 0) {
    iVar1 = nni_dialer_create(&stack0xffffffffffffffd0,pnStack_40,(char *)dp_local);
    if (iVar1 == 0) {
      iVar1 = nni_dialer_start(pnStack_30,d._4_4_);
      if (iVar1 == 0) {
        if (pnStack_20 != (nng_dialer *)0x0) {
          uVar2 = nni_dialer_id(pnStack_30);
          pnStack_20->id = uVar2;
        }
        nni_dialer_rele(pnStack_30);
        addr_local._4_4_ = 0;
      }
      else {
        nni_dialer_close(pnStack_30);
        addr_local._4_4_ = iVar1;
      }
    }
    else {
      nni_sock_rele(pnStack_40);
      addr_local._4_4_ = iVar1;
    }
  }
  return addr_local._4_4_;
}

Assistant:

int
nng_dial(nng_socket sid, const char *addr, nng_dialer *dp, int flags)
{
	nni_dialer *d;
	int         rv;
	nni_sock   *s;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_dialer_create(&d, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	if ((rv = nni_dialer_start(d, flags)) != 0) {
		nni_dialer_close(d);
		return (rv);
	}
	if (dp != NULL) {
		nng_dialer did;
		did.id = nni_dialer_id(d);
		*dp    = did;
	}
	nni_dialer_rele(d);
	return (0);
}